

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int Abc_NtkRecTruthCompare(int *p1,int *p2)

{
  char cVar1;
  char cVar2;
  word *__s1;
  word *__s2;
  int Diff;
  int *p2_local;
  int *p1_local;
  
  cVar1 = Vec_StrEntry(s_pMan3->vSupps,*p1);
  cVar2 = Vec_StrEntry(s_pMan3->vSupps,*p2);
  p1_local._4_4_ = (int)cVar1 - (int)cVar2;
  if (p1_local._4_4_ == 0) {
    __s1 = Vec_MemReadEntry(s_pMan3->vTtMem,*p1);
    __s2 = Vec_MemReadEntry(s_pMan3->vTtMem,*p2);
    p1_local._4_4_ = memcmp(__s1,__s2,(long)s_pMan3->nWords << 3);
  }
  return p1_local._4_4_;
}

Assistant:

int Abc_NtkRecTruthCompare( int * p1, int * p2 ) 
{
    int Diff = Vec_StrEntry( s_pMan3->vSupps, *p1 ) - Vec_StrEntry( s_pMan3->vSupps, *p2 );
    if ( Diff )
        return Diff;
    return memcmp( Vec_MemReadEntry(s_pMan3->vTtMem, *p1), Vec_MemReadEntry(s_pMan3->vTtMem, *p2), sizeof(word) * s_pMan3->nWords ); 
}